

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_36822::required::validate
          (required *this,json_pointer *ptr,json *instance,json_patch *param_3,error_handler *e)

{
  pointer pbVar1;
  bool bVar2;
  long *plVar3;
  pointer pbVar4;
  pointer key;
  const_iterator result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [24];
  undefined4 uStack_40;
  undefined4 uStack_3c;
  json_pointer *local_38;
  
  key = (this->required_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->required_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (key != pbVar1) {
    local_38 = ptr;
    do {
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::find((const_iterator *)local_58,instance,key);
      local_78.field_2._8_8_ = 0x8000000000000000;
      local_78.field_2._M_allocated_capacity = 0;
      local_78._M_string_length = 0;
      if (instance->m_type == array) {
        local_78.field_2._M_allocated_capacity =
             (size_type)
             (((instance->m_value).array)->
             super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
      }
      else if (instance->m_type == object) {
        local_78._M_string_length =
             (size_type)&(((instance->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        local_78.field_2._8_8_ = 1;
      }
      local_78._M_dataplus._M_p = (pointer)instance;
      bVar2 = nlohmann::json_abi_v3_11_2::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::
              operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                        ((const_iterator *)local_58,
                         (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)&local_78);
      if (bVar2) {
        std::operator+(&local_78,"required property \'",key);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
        local_58._0_8_ = local_58 + 0x10;
        pbVar4 = (pointer)(plVar3 + 2);
        if ((pointer)*plVar3 == pbVar4) {
          local_58._16_8_ = *(undefined8 *)pbVar4;
          uStack_40 = (undefined4)plVar3[3];
          uStack_3c = *(undefined4 *)((long)plVar3 + 0x1c);
        }
        else {
          local_58._16_8_ = *(undefined8 *)pbVar4;
          local_58._0_8_ = (pointer)*plVar3;
        }
        local_58._8_8_ = plVar3[1];
        *plVar3 = (long)pbVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        (*e->_vptr_error_handler[2])(e,local_38,instance,(const_iterator *)local_58);
        if ((pointer)local_58._0_8_ != (pointer)(local_58 + 0x10)) {
          operator_delete((void *)local_58._0_8_,(ulong)(local_58._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,
                          (ulong)(local_78.field_2._M_allocated_capacity + 1));
        }
      }
      key = key + 1;
    } while (key != pbVar1);
  }
  return;
}

Assistant:

void validate(const json::json_pointer &ptr, const json &instance, json_patch &, error_handler &e) const override final
	{
		for (auto &r : required_)
			if (instance.find(r) == instance.end())
				e.error(ptr, instance, "required property '" + r + "' not found in object as a dependency");
	}